

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult vmaCreateBufferWithAlignment
                   (VmaAllocator allocator,VkBufferCreateInfo *pBufferCreateInfo,
                   VmaAllocationCreateInfo *pAllocationCreateInfo,VkDeviceSize minAlignment,
                   VkBuffer *pBuffer,VmaAllocation *pAllocation,VmaAllocationInfo *pAllocationInfo)

{
  VmaAllocation hAllocation;
  VmaAllocation *pAllocations;
  VmaAllocationCreateInfo *pVVar1;
  VkResult VVar2;
  VkAllocationCallbacks *pVVar3;
  VmaAllocator this;
  bool requiresDedicatedAllocation;
  bool prefersDedicatedAllocation;
  VkAllocationCallbacks *local_60;
  VmaAllocation *local_58;
  VmaAllocationCreateInfo *local_50;
  VkMemoryRequirements vkMemReq;
  
  VVar2 = VK_ERROR_INITIALIZATION_FAILED;
  if ((pBufferCreateInfo->size != 0) &&
     (((pBufferCreateInfo->usage & 0x20000) == 0 || (allocator->m_UseKhrBufferDeviceAddress == true)
      ))) {
    *pBuffer = (VkBuffer)0x0;
    *pAllocation = (VmaAllocation)0x0;
    local_60 = &allocator->m_AllocationCallbacks;
    pVVar3 = (VkAllocationCallbacks *)0x0;
    if (allocator->m_AllocationCallbacksSpecified != false) {
      pVVar3 = local_60;
    }
    local_50 = pAllocationCreateInfo;
    VVar2 = (*(allocator->m_VulkanFunctions).vkCreateBuffer)
                      (allocator->m_hDevice,pBufferCreateInfo,pVVar3,pBuffer);
    if (VK_ERROR_OUT_OF_HOST_MEMORY < VVar2) {
      vkMemReq.memoryTypeBits = 0;
      vkMemReq._20_4_ = 0;
      vkMemReq.size = 0;
      vkMemReq.alignment = 0;
      requiresDedicatedAllocation = false;
      prefersDedicatedAllocation = false;
      local_58 = pAllocation;
      VmaAllocator_T::GetBufferMemoryRequirements
                (allocator,*pBuffer,&vkMemReq,&requiresDedicatedAllocation,
                 &prefersDedicatedAllocation);
      pVVar1 = local_50;
      pAllocations = local_58;
      if (minAlignment < vkMemReq.alignment) {
        minAlignment = vkMemReq.alignment;
      }
      this = allocator;
      vkMemReq.alignment = minAlignment;
      VVar2 = VmaAllocator_T::AllocateMemory
                        (allocator,&vkMemReq,requiresDedicatedAllocation,prefersDedicatedAllocation,
                         *pBuffer,(VkImage)0x0,pBufferCreateInfo->usage,local_50,
                         VMA_SUBALLOCATION_TYPE_BUFFER,1,local_58);
      if (VK_ERROR_OUT_OF_HOST_MEMORY < VVar2) {
        if (((pVVar1->flags & 0x80) != 0) ||
           (this = allocator,
           VVar2 = VmaAllocator_T::BindBufferMemory(allocator,*pAllocations,0,*pBuffer,(void *)0x0),
           VK_ERROR_OUT_OF_HOST_MEMORY < VVar2)) {
          hAllocation = *pAllocations;
          hAllocation->m_BufferImageUsage = pBufferCreateInfo->usage;
          if (pAllocationInfo == (VmaAllocationInfo *)0x0) {
            return VK_SUCCESS;
          }
          VmaAllocator_T::GetAllocationInfo(this,hAllocation,pAllocationInfo);
          return VK_SUCCESS;
        }
        VmaAllocator_T::FreeMemory(allocator,1,pAllocations);
        *pAllocations = (VmaAllocation)0x0;
      }
      pVVar3 = (VkAllocationCallbacks *)0x0;
      if (allocator->m_AllocationCallbacksSpecified != false) {
        pVVar3 = local_60;
      }
      (*(allocator->m_VulkanFunctions).vkDestroyBuffer)(allocator->m_hDevice,*pBuffer,pVVar3);
      *pBuffer = (VkBuffer)0x0;
    }
  }
  return VVar2;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaCreateBufferWithAlignment(
    VmaAllocator allocator,
    const VkBufferCreateInfo* pBufferCreateInfo,
    const VmaAllocationCreateInfo* pAllocationCreateInfo,
    VkDeviceSize minAlignment,
    VkBuffer* pBuffer,
    VmaAllocation* pAllocation,
    VmaAllocationInfo* pAllocationInfo)
{
    VMA_ASSERT(allocator && pBufferCreateInfo && pAllocationCreateInfo && VmaIsPow2(minAlignment) && pBuffer && pAllocation);

    if(pBufferCreateInfo->size == 0)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }
    if((pBufferCreateInfo->usage & VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT_COPY) != 0 &&
        !allocator->m_UseKhrBufferDeviceAddress)
    {
        VMA_ASSERT(0 && "Creating a buffer with VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT is not valid if VMA_ALLOCATOR_CREATE_BUFFER_DEVICE_ADDRESS_BIT was not used.");
        return VK_ERROR_INITIALIZATION_FAILED;
    }

    VMA_DEBUG_LOG("vmaCreateBufferWithAlignment");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    *pBuffer = VK_NULL_HANDLE;
    *pAllocation = VK_NULL_HANDLE;

    // 1. Create VkBuffer.
    VkResult res = (*allocator->GetVulkanFunctions().vkCreateBuffer)(
        allocator->m_hDevice,
        pBufferCreateInfo,
        allocator->GetAllocationCallbacks(),
        pBuffer);
    if(res >= 0)
    {
        // 2. vkGetBufferMemoryRequirements.
        VkMemoryRequirements vkMemReq = {};
        bool requiresDedicatedAllocation = false;
        bool prefersDedicatedAllocation  = false;
        allocator->GetBufferMemoryRequirements(*pBuffer, vkMemReq,
            requiresDedicatedAllocation, prefersDedicatedAllocation);

        // 2a. Include minAlignment
        vkMemReq.alignment = VMA_MAX(vkMemReq.alignment, minAlignment);

        // 3. Allocate memory using allocator.
        res = allocator->AllocateMemory(
            vkMemReq,
            requiresDedicatedAllocation,
            prefersDedicatedAllocation,
            *pBuffer, // dedicatedBuffer
            VK_NULL_HANDLE, // dedicatedImage
            pBufferCreateInfo->usage, // dedicatedBufferImageUsage
            *pAllocationCreateInfo,
            VMA_SUBALLOCATION_TYPE_BUFFER,
            1, // allocationCount
            pAllocation);

        if(res >= 0)
        {
            // 3. Bind buffer with memory.
            if((pAllocationCreateInfo->flags & VMA_ALLOCATION_CREATE_DONT_BIND_BIT) == 0)
            {
                res = allocator->BindBufferMemory(*pAllocation, 0, *pBuffer, VMA_NULL);
            }
            if(res >= 0)
            {
                // All steps succeeded.
                #if VMA_STATS_STRING_ENABLED
                    (*pAllocation)->InitBufferImageUsage(pBufferCreateInfo->usage);
                #endif
                if(pAllocationInfo != VMA_NULL)
                {
                    allocator->GetAllocationInfo(*pAllocation, pAllocationInfo);
                }

                return VK_SUCCESS;
            }
            allocator->FreeMemory(
                1, // allocationCount
                pAllocation);
            *pAllocation = VK_NULL_HANDLE;
            (*allocator->GetVulkanFunctions().vkDestroyBuffer)(allocator->m_hDevice, *pBuffer, allocator->GetAllocationCallbacks());
            *pBuffer = VK_NULL_HANDLE;
            return res;
        }
        (*allocator->GetVulkanFunctions().vkDestroyBuffer)(allocator->m_hDevice, *pBuffer, allocator->GetAllocationCallbacks());
        *pBuffer = VK_NULL_HANDLE;
        return res;
    }
    return res;
}